

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<unsigned_long_long,QSslServerPrivate::SocketData>::
emplace_helper<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
          (QHash<unsigned_long_long,QSslServerPrivate::SocketData> *this,unsigned_long_long *key,
          Connection *args,Connection *args_1,shared_ptr<QTimer> *args_2)

{
  piter pVar1;
  Node<unsigned_long_long,_QSslServerPrivate::SocketData> *n;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::
  findOrInsert<unsigned_long_long>
            ((InsertionResult *)local_48,
             *(Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> **)this,
             key);
  n = (Node<unsigned_long_long,_QSslServerPrivate::SocketData> *)
      ((((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries)->storage).data +
      (uint)(*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
            [(uint)local_48._8_8_ & 0x7f] * 0x28);
  if (local_48[0x10] == false) {
    QHashPrivate::Node<unsigned_long_long,QSslServerPrivate::SocketData>::
    createInPlace<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
              (n,key,args,args_1,args_2);
  }
  else {
    QHashPrivate::Node<unsigned_long_long,QSslServerPrivate::SocketData>::
    emplaceValue<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
              ((Node<unsigned_long_long,QSslServerPrivate::SocketData> *)n,args,args_1,args_2);
  }
  pVar1.bucket = local_48._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)
            local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }